

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcf_re_range(mpc_val_t *x)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  char *__s;
  mpc_parser_t *pmVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  char *__s_00;
  
  cVar1 = *x;
  __s = (char *)calloc(1,1);
  cVar2 = cVar1;
  if (cVar1 == '^') {
    cVar2 = *(char *)((long)x + 1);
  }
  if (cVar2 == '\0') {
    free(__s);
    free(x);
    pmVar4 = mpc_fail("Invalid Regex Range Expression");
    return pmVar4;
  }
  uVar8 = (ulong)(cVar1 == '^');
  sVar5 = strlen((char *)x);
  if (uVar8 < sVar5) {
    do {
      if (*(char *)((long)x + uVar8) == '-') {
        lVar9 = (long)*(char *)((long)x + uVar8 + 1);
        if (uVar8 == 0 || lVar9 == 0) {
          sVar5 = strlen(__s);
          __s = (char *)realloc(__s,sVar5 + 2);
          sVar5 = strlen(__s);
          (__s + sVar5)[0] = '-';
          (__s + sVar5)[1] = '\0';
        }
        else {
          uVar7 = (ulong)*(char *)((long)x + (uVar8 - 1));
          while (uVar7 = uVar7 + 1, uVar7 <= lVar9 - 1U) {
            sVar5 = strlen(__s);
            __s = (char *)realloc(__s,sVar5 + 3);
            sVar5 = strlen(__s);
            __s[sVar5 + 1] = '\0';
            sVar5 = strlen(__s);
            __s[sVar5] = (char)uVar7;
          }
        }
      }
      else {
        if (*(char *)((long)x + uVar8) == '\\') {
          cVar2 = *(char *)((long)x + uVar8 + 1);
          switch(cVar2) {
          case 'a':
            bVar3 = false;
            __s_00 = "\a";
            break;
          case 'b':
            bVar3 = false;
            __s_00 = "\b";
            break;
          case 'c':
          case 'e':
          case 'g':
          case 'h':
          case 'i':
          case 'j':
          case 'k':
          case 'l':
          case 'm':
          case 'o':
          case 'p':
          case 'q':
          case 'u':
switchD_001e302e_caseD_63:
            bVar3 = true;
            __s_00 = (char *)0x0;
            break;
          case 'd':
            bVar3 = false;
            __s_00 = "0123456789";
            break;
          case 'f':
            bVar3 = false;
            __s_00 = "\f";
            break;
          case 'n':
            bVar3 = false;
            __s_00 = "\n";
            break;
          case 'r':
            bVar3 = false;
            __s_00 = "\r";
            break;
          case 's':
            bVar3 = false;
            __s_00 = " \f\n\r\t\v";
            break;
          case 't':
            bVar3 = false;
            __s_00 = "\t";
            break;
          case 'v':
            bVar3 = false;
            __s_00 = "\v";
            break;
          case 'w':
            bVar3 = false;
            __s_00 = "abcdefghijklmnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ0123456789_";
            break;
          default:
            if (cVar2 != '-') goto switchD_001e302e_caseD_63;
            bVar3 = false;
            __s_00 = "-";
          }
          uVar8 = uVar8 + 1;
          sVar5 = strlen(__s);
          if (!bVar3) {
            sVar6 = strlen(__s_00);
            __s = (char *)realloc(__s,sVar5 + sVar6 + 1);
            strcat(__s,__s_00);
            goto LAB_001e31be;
          }
        }
        else {
          sVar5 = strlen(__s);
        }
        __s = (char *)realloc(__s,sVar5 + 2);
        sVar5 = strlen(__s);
        __s[sVar5 + 1] = '\0';
        cVar2 = *(char *)((long)x + uVar8);
        sVar5 = strlen(__s);
        __s[sVar5] = cVar2;
      }
LAB_001e31be:
      uVar8 = uVar8 + 1;
      sVar5 = strlen((char *)x);
    } while (uVar8 < sVar5);
  }
  if (cVar1 == '^') {
    pmVar4 = mpc_noneof(__s);
  }
  else {
    pmVar4 = mpc_oneof(__s);
  }
  free(x);
  free(__s);
  return pmVar4;
}

Assistant:

static mpc_val_t *mpcf_re_range(mpc_val_t *x) {

  mpc_parser_t *out;
  size_t i, j;
  size_t start, end;
  const char *tmp = NULL;
  const char *s = x;
  int comp = s[0] == '^' ? 1 : 0;
  char *range = calloc(1,1);

  if (s[0] == '\0') { free(range); free(x); return mpc_fail("Invalid Regex Range Expression"); }
  if (s[0] == '^' &&
      s[1] == '\0') { free(range); free(x); return mpc_fail("Invalid Regex Range Expression"); }

  for (i = comp; i < strlen(s); i++){

    /* Regex Range Escape */
    if (s[i] == '\\') {
      tmp = mpc_re_range_escape_char(s[i+1]);
      if (tmp != NULL) {
        range = realloc(range, strlen(range) + strlen(tmp) + 1);
        strcat(range, tmp);
      } else {
        range = realloc(range, strlen(range) + 1 + 1);
        range[strlen(range) + 1] = '\0';
        range[strlen(range) + 0] = s[i+1];
      }
      i++;
    }

    /* Regex Range...Range */
    else if (s[i] == '-') {
      if (s[i+1] == '\0' || i == 0) {
          range = realloc(range, strlen(range) + strlen("-") + 1);
          strcat(range, "-");
      } else {
        start = s[i-1]+1;
        end = s[i+1]-1;
        for (j = start; j <= end; j++) {
          range = realloc(range, strlen(range) + 1 + 1 + 1);
          range[strlen(range) + 1] = '\0';
          range[strlen(range) + 0] = (char)j;
        }
      }
    }

    /* Regex Range Normal */
    else {
      range = realloc(range, strlen(range) + 1 + 1);
      range[strlen(range) + 1] = '\0';
      range[strlen(range) + 0] = s[i];
    }

  }

  out = comp == 1 ? mpc_noneof(range) : mpc_oneof(range);

  free(x);
  free(range);

  return out;
}